

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  PrimRefMB *pPVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar19;
  long lVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  size_t *psVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar52;
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar60;
  undefined1 auVar57 [16];
  float fVar59;
  undefined1 auVar58 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  ulong local_228;
  size_t local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  ulong local_190;
  anon_class_16_2_07cfa4d6 local_188;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong uVar18;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar23 = r->_begin;
  auVar62 = ZEXT464(0x3f800000);
  auVar33._8_4_ = 0x7f800000;
  auVar33._0_8_ = 0x7f8000007f800000;
  auVar33._12_4_ = 0x7f800000;
  auVar71 = ZEXT1664(auVar33);
  auVar32._8_4_ = 0xff800000;
  auVar32._0_8_ = 0xff800000ff800000;
  auVar32._12_4_ = 0xff800000;
  auVar67 = ZEXT1664(auVar32);
  fVar29 = 1.0;
  auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
  local_228 = 0;
  auVar72 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar73 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar74 = ZEXT1664(auVar31);
  fVar30 = 0.0;
  auVar75 = ZEXT1664(auVar32);
  auVar76 = ZEXT1664(auVar33);
  auVar78 = ZEXT1664(auVar32);
  auVar79 = ZEXT1664(auVar33);
  auVar31 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar77 = ZEXT1664(auVar31);
  local_200 = k;
  while( true ) {
    auVar31 = auVar62._0_16_;
    if (r->_end <= uVar23) {
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = auVar79._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = auVar78._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar76._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar75._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar71._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar67._0_16_;
      BVar2 = (BBox1f)vmovlps_avx(auVar31);
      __return_storage_ptr__->time_range = BVar2;
      auVar31 = vmovdqu64_avx512vl(auVar77._0_16_);
      *(undefined1 (*) [16])&(__return_storage_ptr__->object_range)._end = auVar31;
      __return_storage_ptr__->max_num_time_segments = local_228;
      (__return_storage_ptr__->max_time_range).lower = fVar30;
      (__return_storage_ptr__->max_time_range).upper = fVar29;
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar38._8_8_ = 0;
    auVar38._0_4_ = BVar2.lower;
    auVar38._4_4_ = BVar2.upper;
    auVar32 = vmovshdup_avx(auVar38);
    fVar34 = BVar2.lower;
    fVar35 = auVar32._0_4_ - fVar34;
    uVar17 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                super_CurveGeometry.field_0x68 * uVar23);
    pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             vertices.items;
    if ((ulong)(uVar17 + 3) < (pBVar3->super_RawBufferView).num) break;
LAB_01c1bbb1:
    uVar23 = uVar23 + 1;
  }
  fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  auVar32 = vmulss_avx512f(ZEXT416((uint)fVar1),
                           ZEXT416((uint)(((t0t1->upper - fVar34) / fVar35) * 0.99999976)));
  auVar32 = vroundss_avx(auVar32,auVar32,10);
  auVar33 = vminss_avx512f(auVar32,ZEXT416((uint)fVar1));
  fVar48 = (t0t1->lower - fVar34) / fVar35;
  auVar32 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar48 * 1.0000002)));
  auVar32 = vroundss_avx(auVar32,auVar32,9);
  auVar32 = vmaxss_avx(auVar58._0_16_,auVar32);
  psVar26 = &pBVar3[(int)auVar32._0_4_].super_RawBufferView.stride;
  uVar22 = (long)(int)auVar32._0_4_ - 1;
LAB_01c1ba90:
  uVar22 = uVar22 + 1;
  if ((ulong)(long)(int)auVar33._0_4_ < uVar22) {
    auVar32 = vmovdqa64_avx512vl(auVar77._0_16_);
    local_188.primID = &local_190;
    fVar35 = (t0t1->upper - fVar34) / fVar35;
    fVar34 = fVar1 * fVar48;
    fVar37 = fVar1 * fVar35;
    auVar66 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
    auVar70 = vroundss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),10);
    auVar33 = vmaxss_avx(auVar66,auVar58._0_16_);
    auVar38 = vminss_avx(auVar70,ZEXT416((uint)fVar1));
    iVar25 = (int)auVar33._0_4_;
    fVar47 = auVar38._0_4_;
    iVar16 = (int)auVar66._0_4_;
    iVar19 = -1;
    if (-1 < iVar16) {
      iVar19 = iVar16;
    }
    iVar15 = (int)fVar1 + 1;
    if ((int)auVar70._0_4_ < (int)fVar1 + 1) {
      iVar15 = (int)auVar70._0_4_;
    }
    local_190 = uVar23;
    local_188.this = this;
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_188,(long)iVar25);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_188,(long)(int)fVar47);
    fVar34 = fVar34 - auVar33._0_4_;
    if (iVar15 - iVar19 == 1) {
      auVar33 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
      fVar34 = auVar33._0_4_;
      fVar35 = 1.0 - fVar34;
      auVar63._0_4_ = fVar34 * bupper1.lower.field_0._0_4_;
      auVar63._4_4_ = fVar34 * bupper1.lower.field_0._4_4_;
      auVar63._8_4_ = fVar34 * bupper1.lower.field_0._8_4_;
      auVar63._12_4_ = fVar34 * bupper1.lower.field_0._12_4_;
      auVar41._4_4_ = fVar35;
      auVar41._0_4_ = fVar35;
      auVar41._8_4_ = fVar35;
      auVar41._12_4_ = fVar35;
      auVar66 = vfmadd231ps_fma(auVar63,auVar41,(undefined1  [16])blower0.lower.field_0);
      auVar68._0_4_ = fVar34 * bupper1.upper.field_0._0_4_;
      auVar68._4_4_ = fVar34 * bupper1.upper.field_0._4_4_;
      auVar68._8_4_ = fVar34 * bupper1.upper.field_0._8_4_;
      auVar68._12_4_ = fVar34 * bupper1.upper.field_0._12_4_;
      auVar70 = vfmadd231ps_fma(auVar68,(undefined1  [16])blower0.upper.field_0,auVar41);
      auVar33 = vmaxss_avx(ZEXT416((uint)(fVar47 - fVar37)),ZEXT816(0) << 0x40);
      fVar34 = auVar33._0_4_;
      fVar35 = 1.0 - fVar34;
      auVar49._0_4_ = fVar34 * blower0.lower.field_0._0_4_;
      auVar49._4_4_ = fVar34 * blower0.lower.field_0._4_4_;
      auVar49._8_4_ = fVar34 * blower0.lower.field_0._8_4_;
      auVar49._12_4_ = fVar34 * blower0.lower.field_0._12_4_;
      auVar42._4_4_ = fVar35;
      auVar42._0_4_ = fVar35;
      auVar42._8_4_ = fVar35;
      auVar42._12_4_ = fVar35;
      auVar51 = vfmadd231ps_fma(auVar49,auVar42,(undefined1  [16])bupper1.lower.field_0);
      auVar53._0_4_ = fVar34 * blower0.upper.field_0._0_4_;
      auVar53._4_4_ = fVar34 * blower0.upper.field_0._4_4_;
      auVar53._8_4_ = fVar34 * blower0.upper.field_0._8_4_;
      auVar53._12_4_ = fVar34 * blower0.upper.field_0._12_4_;
      auVar57 = vfmadd231ps_fma(auVar53,auVar42,(undefined1  [16])bupper1.upper.field_0);
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_188,(long)(iVar25 + 1));
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_188,(long)((int)fVar47 + -1));
      auVar33 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
      fVar36 = auVar33._0_4_;
      fVar34 = 1.0 - fVar36;
      auVar65._0_4_ = fVar36 * blower1.lower.field_0.m128[0];
      auVar65._4_4_ = fVar36 * blower1.lower.field_0.m128[1];
      auVar65._8_4_ = fVar36 * blower1.lower.field_0.m128[2];
      auVar65._12_4_ = fVar36 * blower1.lower.field_0.m128[3];
      auVar43._4_4_ = fVar34;
      auVar43._0_4_ = fVar34;
      auVar43._8_4_ = fVar34;
      auVar43._12_4_ = fVar34;
      auVar66 = vfmadd231ps_fma(auVar65,auVar43,(undefined1  [16])blower0.lower.field_0);
      auVar69._0_4_ = fVar36 * blower1.upper.field_0.m128[0];
      auVar69._4_4_ = fVar36 * blower1.upper.field_0.m128[1];
      auVar69._8_4_ = fVar36 * blower1.upper.field_0.m128[2];
      auVar69._12_4_ = fVar36 * blower1.upper.field_0.m128[3];
      auVar70 = vfmadd231ps_fma(auVar69,auVar43,(undefined1  [16])blower0.upper.field_0);
      auVar33 = vmaxss_avx(ZEXT416((uint)(fVar47 - fVar37)),ZEXT816(0) << 0x40);
      fVar37 = auVar33._0_4_;
      fVar34 = 1.0 - fVar37;
      auVar50._0_4_ = fVar37 * bupper0.lower.field_0.m128[0];
      auVar50._4_4_ = fVar37 * bupper0.lower.field_0.m128[1];
      auVar50._8_4_ = fVar37 * bupper0.lower.field_0.m128[2];
      auVar50._12_4_ = fVar37 * bupper0.lower.field_0.m128[3];
      auVar44._4_4_ = fVar34;
      auVar44._0_4_ = fVar34;
      auVar44._8_4_ = fVar34;
      auVar44._12_4_ = fVar34;
      auVar51 = vfmadd231ps_fma(auVar50,auVar44,(undefined1  [16])bupper1.lower.field_0);
      auVar56._0_4_ = fVar37 * bupper0.upper.field_0.m128[0];
      auVar56._4_4_ = fVar37 * bupper0.upper.field_0.m128[1];
      auVar56._8_4_ = fVar37 * bupper0.upper.field_0.m128[2];
      auVar56._12_4_ = fVar37 * bupper0.upper.field_0.m128[3];
      auVar57 = vfmadd231ps_fma(auVar56,auVar44,(undefined1  [16])bupper1.upper.field_0);
      if (iVar16 < 0) {
        iVar16 = -1;
      }
      sVar21 = (size_t)iVar16;
      while (sVar21 = sVar21 + 1, (long)sVar21 < (long)iVar15) {
        fVar37 = ((float)(int)sVar21 / fVar1 - fVar48) / (fVar35 - fVar48);
        fVar34 = 1.0 - fVar37;
        auVar46._0_4_ = auVar51._0_4_ * fVar37;
        fVar47 = auVar51._4_4_;
        auVar46._4_4_ = fVar47 * fVar37;
        fVar36 = auVar51._8_4_;
        auVar46._8_4_ = fVar36 * fVar37;
        fVar52 = auVar51._12_4_;
        auVar46._12_4_ = fVar52 * fVar37;
        auVar45._4_4_ = fVar34;
        auVar45._0_4_ = fVar34;
        auVar45._8_4_ = fVar34;
        auVar45._12_4_ = fVar34;
        auVar33 = vfmadd231ps_fma(auVar46,auVar45,auVar66);
        auVar40._0_4_ = auVar57._0_4_ * fVar37;
        fVar34 = auVar57._4_4_;
        auVar40._4_4_ = fVar34 * fVar37;
        fVar59 = auVar57._8_4_;
        auVar40._8_4_ = fVar59 * fVar37;
        fVar60 = auVar57._12_4_;
        auVar40._12_4_ = fVar60 * fVar37;
        auVar38 = vfmadd231ps_fma(auVar40,auVar70,auVar45);
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_188,sVar21);
        local_1f8 = auVar70._0_4_;
        fStack_1f4 = auVar70._4_4_;
        fStack_1f0 = auVar70._8_4_;
        fStack_1ec = auVar70._12_4_;
        local_1e8 = auVar66._0_4_;
        fStack_1e4 = auVar66._4_4_;
        fStack_1e0 = auVar66._8_4_;
        fStack_1dc = auVar66._12_4_;
        auVar33 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar33);
        auVar66 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar38);
        auVar38 = vminps_avx(auVar33,ZEXT816(0) << 0x40);
        auVar33 = vmaxps_avx(auVar66,ZEXT816(0) << 0x40);
        auVar66._0_4_ = local_1e8 + auVar38._0_4_;
        auVar66._4_4_ = fStack_1e4 + auVar38._4_4_;
        auVar66._8_4_ = fStack_1e0 + auVar38._8_4_;
        auVar66._12_4_ = fStack_1dc + auVar38._12_4_;
        auVar51._0_4_ = auVar51._0_4_ + auVar38._0_4_;
        auVar51._4_4_ = fVar47 + auVar38._4_4_;
        auVar51._8_4_ = fVar36 + auVar38._8_4_;
        auVar51._12_4_ = fVar52 + auVar38._12_4_;
        auVar70._0_4_ = local_1f8 + auVar33._0_4_;
        auVar70._4_4_ = fStack_1f4 + auVar33._4_4_;
        auVar70._8_4_ = fStack_1f0 + auVar33._8_4_;
        auVar70._12_4_ = fStack_1ec + auVar33._12_4_;
        auVar57._0_4_ = auVar57._0_4_ + auVar33._0_4_;
        auVar57._4_4_ = fVar34 + auVar33._4_4_;
        auVar57._8_4_ = fVar59 + auVar33._8_4_;
        auVar57._12_4_ = fVar60 + auVar33._12_4_;
      }
    }
    aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar66,ZEXT416(geomID),0x30);
    uVar17 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             super_Geometry.numTimeSteps - 1;
    uVar18 = (ulong)uVar17;
    BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar39._8_8_ = 0;
    auVar39._0_4_ = BVar2.lower;
    auVar39._4_4_ = BVar2.upper;
    aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx(auVar70,ZEXT416((uint)uVar23),0x30);
    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar51,ZEXT416(uVar17),0x30);
    aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar57,ZEXT416(uVar17),0x30);
    auVar64._8_4_ = 0x3f000000;
    auVar64._0_8_ = 0x3f0000003f000000;
    auVar64._12_4_ = 0x3f000000;
    auVar54._0_4_ = aVar11.x * 0.5;
    auVar54._4_4_ = aVar11.y * 0.5;
    auVar54._8_4_ = aVar11.z * 0.5;
    auVar54._12_4_ = aVar11.field_3.w * 0.5;
    auVar33 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar9,auVar64);
    auVar61._0_4_ = aVar12.x * 0.5;
    auVar61._4_4_ = aVar12.y * 0.5;
    auVar61._8_4_ = aVar12.z * 0.5;
    auVar61._12_4_ = aVar12.field_3.w * 0.5;
    auVar38 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar10,auVar64);
    auVar55._0_4_ = auVar33._0_4_ + auVar38._0_4_;
    auVar55._4_4_ = auVar33._4_4_ + auVar38._4_4_;
    auVar55._8_4_ = auVar33._8_4_ + auVar38._8_4_;
    auVar55._12_4_ = auVar33._12_4_ + auVar38._12_4_;
    auVar33 = vminps_avx512vl((undefined1  [16])auVar79._0_16_,(undefined1  [16])aVar9);
    auVar79 = ZEXT1664(auVar33);
    auVar33 = vmaxps_avx512vl((undefined1  [16])auVar78._0_16_,(undefined1  [16])aVar10);
    auVar78 = ZEXT1664(auVar33);
    auVar33 = vminps_avx512vl((undefined1  [16])auVar76._0_16_,(undefined1  [16])aVar11);
    auVar76 = ZEXT1664(auVar33);
    auVar33 = vmaxps_avx512vl((undefined1  [16])auVar75._0_16_,(undefined1  [16])aVar12);
    auVar75 = ZEXT1664(auVar33);
    auVar33 = vminps_avx((undefined1  [16])auVar71._0_16_,auVar55);
    auVar71 = ZEXT1664(auVar33);
    auVar33 = vmaxps_avx((undefined1  [16])auVar67._0_16_,auVar55);
    auVar67 = ZEXT1664(auVar33);
    uVar22 = vcmpps_avx512vl(auVar31,auVar39,1);
    auVar33 = vinsertps_avx(auVar31,auVar39,0x50);
    auVar31 = vblendps_avx(auVar39,auVar31,2);
    bVar28 = (bool)((byte)uVar22 & 1);
    bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
    bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
    auVar62 = ZEXT1664(CONCAT412((uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar31._12_4_,
                                 CONCAT48((uint)bVar7 * auVar33._8_4_ | (uint)!bVar7 * auVar31._8_4_
                                          ,CONCAT44((uint)bVar6 * auVar33._4_4_ |
                                                    (uint)!bVar6 * auVar31._4_4_,
                                                    (uint)bVar28 * auVar33._0_4_ |
                                                    (uint)!bVar28 * auVar31._0_4_))));
    auVar31 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar31 = vpinsrq_avx(auVar31,uVar18,1);
    auVar32 = vmovdqa64_avx512vl(auVar32);
    auVar31 = vpaddq_avx512vl(auVar32,auVar31);
    auVar77 = ZEXT1664(auVar31);
    bVar28 = local_228 < uVar18;
    auVar31 = vmovshdup_avx(auVar39);
    fVar29 = (float)((uint)bVar28 * auVar31._0_4_ + (uint)!bVar28 * (int)fVar29);
    fVar30 = (float)((uint)bVar28 * (int)BVar2.lower + (uint)!bVar28 * (int)fVar30);
    if (local_228 <= uVar18) {
      local_228 = uVar18;
    }
    pPVar5 = prims->items;
    pPVar5[local_200].lbounds.bounds0.lower.field_0 = aVar9;
    pPVar5[local_200].lbounds.bounds0.upper.field_0 = aVar10;
    pPVar5[local_200].lbounds.bounds1.lower.field_0.field_1 = aVar11;
    pPVar5[local_200].lbounds.bounds1.upper.field_0.field_1 = aVar12;
    pPVar5[local_200].time_range = BVar2;
    auVar58 = ZEXT864(0) << 0x20;
    auVar72 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar73 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar31 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    auVar74 = ZEXT1664(auVar31);
    local_200 = local_200 + 1;
  }
  else {
    pcVar4 = ((RawBufferView *)(psVar26 + -2))->ptr_ofs;
    sVar21 = *psVar26;
    auVar38 = auVar72._0_16_;
    auVar32 = vandps_avx(auVar38,ZEXT416(*(uint *)(pcVar4 + sVar21 * uVar17 + 0xc)));
    if (auVar32._0_4_ < 1.844e+18) {
      lVar27 = sVar21 * (uVar17 + 1);
      auVar32 = vandps_avx(auVar38,ZEXT416(*(uint *)(pcVar4 + lVar27 + 0xc)));
      if (auVar32._0_4_ < 1.844e+18) {
        lVar20 = sVar21 * (uVar17 + 2);
        auVar32 = vandps_avx(auVar38,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)));
        if (auVar32._0_4_ < 1.844e+18) {
          lVar24 = sVar21 * (uVar17 + 3);
          auVar32 = vandps_avx(auVar38,ZEXT416(*(uint *)(pcVar4 + lVar24 + 0xc)));
          if (auVar32._0_4_ < 1.844e+18) {
            auVar32 = auVar73._0_16_;
            uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + sVar21 * uVar17),auVar32,6);
            auVar38 = auVar74._0_16_;
            uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + sVar21 * uVar17),auVar38,1);
            if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) {
              uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar27),auVar32,6);
              uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar27),auVar38,1);
              if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) {
                uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar20),auVar32,6);
                uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar20),auVar38,1);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) goto code_r0x01c1bb76;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_01c1bbb1;
code_r0x01c1bb76:
  psVar26 = psVar26 + 7;
  uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar24),auVar32,6);
  uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar24),auVar38,1);
  if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) goto LAB_01c1bbb1;
  goto LAB_01c1ba90;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }